

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

png_uint_32 png_read_chunk_header(png_structrp png_ptr)

{
  uint length;
  png_byte buf [8];
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  
  png_ptr->io_state = 0x21;
  png_read_data(png_ptr,&local_20,8);
  if (-1 < (int)((uint)local_20 << 0x18)) {
    length = (uint)local_1d | (uint)local_1f << 0x10 | (uint)local_1e << 8 | (uint)local_20 << 0x18;
    png_ptr->chunk_name =
         local_1c >> 0x18 | (local_1c & 0xff0000) >> 8 | (local_1c & 0xff00) << 8 | local_1c << 0x18
    ;
    png_reset_crc(png_ptr);
    png_calculate_crc(png_ptr,(png_const_bytep)&local_1c,4);
    png_check_chunk_name(png_ptr,png_ptr->chunk_name);
    png_check_chunk_length(png_ptr,length);
    png_ptr->io_state = 0x41;
    return length;
  }
  png_error(png_ptr,"PNG unsigned integer out of range");
}

Assistant:

png_uint_32 /* PRIVATE */
png_read_chunk_header(png_structrp png_ptr)
{
   png_byte buf[8];
   png_uint_32 length;

#ifdef PNG_IO_STATE_SUPPORTED
   png_ptr->io_state = PNG_IO_READING | PNG_IO_CHUNK_HDR;
#endif

   /* Read the length and the chunk name.
    * This must be performed in a single I/O call.
    */
   png_read_data(png_ptr, buf, 8);
   length = png_get_uint_31(png_ptr, buf);

   /* Put the chunk name into png_ptr->chunk_name. */
   png_ptr->chunk_name = PNG_CHUNK_FROM_STRING(buf+4);

   png_debug2(0, "Reading %lx chunk, length = %lu",
       (unsigned long)png_ptr->chunk_name, (unsigned long)length);

   /* Reset the crc and run it over the chunk name. */
   png_reset_crc(png_ptr);
   png_calculate_crc(png_ptr, buf + 4, 4);

   /* Check to see if chunk name is valid. */
   png_check_chunk_name(png_ptr, png_ptr->chunk_name);

   /* Check for too-large chunk length */
   png_check_chunk_length(png_ptr, length);

#ifdef PNG_IO_STATE_SUPPORTED
   png_ptr->io_state = PNG_IO_READING | PNG_IO_CHUNK_DATA;
#endif

   return length;
}